

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O2

error_code __thiscall
cinatra::coro_http_client::handle_header
          (coro_http_client *this,resp_data *data,http_parser *parser,size_t header_size)

{
  long lVar1;
  size_t sVar2;
  basic_streambuf<std::allocator<char>_> *pbVar3;
  int iVar4;
  error_category *peVar5;
  error_code eVar6;
  undefined8 uStack_30;
  cerr_logger_t local_21;
  
  iVar4 = http_parser::parse_response(parser,*(char **)&this->head_buf_->field_0x10,header_size,0);
  if (iVar4 < 0) {
    pbVar3 = this->head_buf_;
    asio::basic_streambuf<std::allocator<char>_>::consume
              (pbVar3,*(long *)&pbVar3->field_0x28 - *(long *)&pbVar3->field_0x10);
    uStack_30 = 0x47;
  }
  else {
    lVar1 = (this->parser_).body_len_;
    if ((-1 < lVar1) && (lVar1 <= this->max_http_body_len_)) {
      asio::basic_streambuf<std::allocator<char>_>::consume(this->head_buf_,header_size);
      sVar2 = parser->num_headers_;
      (data->resp_headers)._M_ptr = (parser->headers_)._M_elems;
      (data->resp_headers)._M_extent._M_extent_value = sVar2;
      data->status = parser->status_;
      uStack_30 = 0;
      peVar5 = (error_category *)std::_V2::system_category();
      goto LAB_0012075f;
    }
    std::operator<<((ostream *)&std::cerr,"invalid http content length: ");
    std::ostream::_M_insert<long>((long)&std::cerr);
    cerr_logger_t::~cerr_logger_t(&local_21);
    pbVar3 = this->head_buf_;
    asio::basic_streambuf<std::allocator<char>_>::consume
              (pbVar3,*(long *)&pbVar3->field_0x28 - *(long *)&pbVar3->field_0x10);
    uStack_30 = 0x16;
  }
  peVar5 = (error_category *)std::_V2::generic_category();
LAB_0012075f:
  eVar6._M_cat = peVar5;
  eVar6._0_8_ = uStack_30;
  return eVar6;
}

Assistant:

std::error_code handle_header(resp_data &data, http_parser &parser,
                                size_t header_size) {
    // parse header
    const char *data_ptr = asio::buffer_cast<const char *>(head_buf_.data());

    int parse_ret = parser.parse_response(data_ptr, header_size, 0);
#ifdef INJECT_FOR_HTTP_CLIENT_TEST
    if (parse_failed_forever_) {
      parse_ret = -1;
    }
#endif
    if (parse_ret < 0) [[unlikely]] {
      head_buf_.consume(head_buf_.size());
      return std::make_error_code(std::errc::protocol_error);
    }

    if (parser_.body_len() > max_http_body_len_ || parser_.body_len() < 0)
        [[unlikely]] {
      CINATRA_LOG_ERROR << "invalid http content length: "
                        << parser_.body_len();
      head_buf_.consume(head_buf_.size());
      return std::make_error_code(std::errc::invalid_argument);
    }

    head_buf_.consume(header_size);  // header size
    data.resp_headers = parser.get_headers();
    data.status = parser.status();
    return {};
  }